

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

CheckedError __thiscall
flatbuffers::Parser::CheckClash
          (Parser *this,
          vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *fields,
          StructDef *struct_def,char *suffix,BaseType basetype)

{
  bool bVar1;
  int iVar2;
  reference ppFVar3;
  FieldDef **ppFVar4;
  long lVar5;
  FieldDef *pFVar6;
  undefined4 in_register_00000084;
  BaseType in_R9D;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_80;
  FieldDef *local_60;
  FieldDef *field;
  string *fname;
  __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_48;
  iterator it;
  size_t len;
  BaseType basetype_local;
  char *suffix_local;
  StructDef *struct_def_local;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *fields_local;
  Parser *this_local;
  
  it._M_current = (FieldDef **)strlen((char *)CONCAT44(in_register_00000084,basetype));
  local_48._M_current =
       (FieldDef **)
       std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                 ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
                  struct_def);
  do {
    fname = (string *)
            std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                      ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
                       struct_def);
    bVar1 = __gnu_cxx::operator!=
                      (&local_48,
                       (__normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                        *)&fname);
    if (!bVar1) {
      anon_unknown_0::NoError();
LAB_0012476e:
      return SUB82(this,0);
    }
    ppFVar3 = __gnu_cxx::
              __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
              ::operator*(&local_48);
    field = *ppFVar3;
    ppFVar4 = (FieldDef **)std::__cxx11::string::length();
    pFVar6 = field;
    if (it._M_current < ppFVar4) {
      lVar5 = std::__cxx11::string::length();
      iVar2 = std::__cxx11::string::compare
                        ((ulong)pFVar6,lVar5 - (long)it._M_current,(char *)it._M_current);
      if ((iVar2 == 0) &&
         (ppFVar3 = __gnu_cxx::
                    __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                    ::operator*(&local_48), pFVar6 = field,
         ((*ppFVar3)->value).type.base_type != BASE_TYPE_UTYPE)) {
        std::__cxx11::string::length();
        std::__cxx11::string::substr((ulong)&local_80,(ulong)pFVar6);
        pFVar6 = SymbolTable<flatbuffers::FieldDef>::Lookup
                           ((SymbolTable<flatbuffers::FieldDef> *)(suffix + 200),&local_80);
        std::__cxx11::string::~string((string *)&local_80);
        local_60 = pFVar6;
        if ((pFVar6 != (FieldDef *)0x0) && ((pFVar6->value).type.base_type == in_R9D)) {
          std::operator+(&local_f0,"Field ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)field)
          ;
          std::operator+(&local_d0,&local_f0," would clash with generated functions for field ");
          std::operator+(&local_b0,&local_d0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_60);
          Error(this,(string *)fields);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_d0);
          std::__cxx11::string::~string((string *)&local_f0);
          goto LAB_0012476e;
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
    ::operator++(&local_48);
  } while( true );
}

Assistant:

CheckedError Parser::CheckClash(std::vector<FieldDef *> &fields,
                                StructDef *struct_def, const char *suffix,
                                BaseType basetype) {
  auto len = strlen(suffix);
  for (auto it = fields.begin(); it != fields.end(); ++it) {
    auto &fname = (*it)->name;
    if (fname.length() > len &&
        fname.compare(fname.length() - len, len, suffix) == 0 &&
        (*it)->value.type.base_type != BASE_TYPE_UTYPE) {
      auto field =
          struct_def->fields.Lookup(fname.substr(0, fname.length() - len));
      if (field && field->value.type.base_type == basetype)
        return Error("Field " + fname +
                     " would clash with generated functions for field " +
                     field->name);
    }
  }
  return NoError();
}